

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ipoint.cpp
# Opt level: O0

int ON_2iVector::Compare(ON_2iVector *lhs,ON_2iVector *rhs)

{
  ON_2iVector *rhs_local;
  ON_2iVector *lhs_local;
  
  if (lhs->x < rhs->x) {
    lhs_local._4_4_ = -1;
  }
  else if (rhs->x < lhs->x) {
    lhs_local._4_4_ = 1;
  }
  else if (lhs->y < rhs->y) {
    lhs_local._4_4_ = -1;
  }
  else if (rhs->y < lhs->y) {
    lhs_local._4_4_ = 1;
  }
  else {
    lhs_local._4_4_ = 0;
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_2iVector::Compare(
  const ON_2iVector& lhs,
  const ON_2iVector& rhs
)
{
  if (lhs.x < rhs.x)
    return -1;
  if (lhs.x > rhs.x)
    return 1;
  if (lhs.y < rhs.y)
    return -1;
  if (lhs.y > rhs.y)
    return 1;
  return 0;
}